

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  thread count_thread2;
  thread count_thread1;
  thread tStack_18;
  thread local_10;
  
  std::thread::thread<void(&)(),,void>(&local_10,count);
  std::thread::thread<void(&)(),,void>(&tStack_18,count);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&tStack_18);
  std::thread::~thread(&local_10);
  return 0;
}

Assistant:

int main() {
//  std::thread test_thread(test);
//  test_thread.join();

  std::thread count_thread1(count), count_thread2(count);
  count_thread1.join();
  count_thread2.join();
//  test();
//  ins::LLogMessage("a.txt", "aaa", 1, 1) << "Aaa";
  return 0;
}